

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_test(stbi__context *s)

{
  byte bVar1;
  stbi_uc sVar2;
  uint n;
  uint uVar3;
  int iVar4;
  stbi__context *in_RDI;
  int tga_color_type;
  int sz;
  int res;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar5;
  
  iVar5 = 0;
  stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
  ;
  n = (uint)bVar1;
  if (1 < n) goto LAB_001229e3;
  bVar1 = stbi__get8((stbi__context *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe8));
  uVar3 = (uint)bVar1;
  if (n == 1) {
    if ((uVar3 != 1) && (uVar3 != 9)) goto LAB_001229e3;
    stbi__skip((stbi__context *)CONCAT44(iVar5,uVar3),1);
    bVar1 = stbi__get8((stbi__context *)CONCAT44(n,in_stack_ffffffffffffffe8));
    uVar3 = (uint)bVar1;
    if (((uVar3 != 8) && ((uVar3 != 0xf && (uVar3 != 0x10)))) &&
       ((uVar3 != 0x18 && (uVar3 != 0x20)))) goto LAB_001229e3;
    stbi__skip((stbi__context *)CONCAT44(iVar5,uVar3),n);
  }
  else {
    if ((((uVar3 != 2) && (uVar3 != 3)) && (uVar3 != 10)) && (uVar3 != 0xb)) goto LAB_001229e3;
    stbi__skip((stbi__context *)CONCAT44(iVar5,uVar3),n);
  }
  iVar4 = stbi__get16le((stbi__context *)CONCAT44(iVar5,uVar3));
  if ((((0 < iVar4) && (iVar4 = stbi__get16le((stbi__context *)CONCAT44(iVar5,uVar3)), 0 < iVar4))
      && ((sVar2 = stbi__get8((stbi__context *)CONCAT44(n,in_stack_ffffffffffffffe8)), n != 1 ||
          ((sVar2 == '\b' || (sVar2 == '\x10')))))) &&
     ((sVar2 == '\b' ||
      ((((sVar2 == '\x0f' || (sVar2 == '\x10')) || (sVar2 == '\x18')) || (sVar2 == ' ')))))) {
    iVar5 = 1;
  }
LAB_001229e3:
  stbi__rewind(in_RDI);
  return iVar5;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res = 0;
   int sz, tga_color_type;
   stbi__get8(s);      //   discard Offset
   tga_color_type = stbi__get8(s);   //   color type
   if ( tga_color_type > 1 ) goto errorEnd;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( tga_color_type == 1 ) { // colormapped (paletted) image
      if (sz != 1 && sz != 9) goto errorEnd; // colortype 1 demands image type 1 or 9
      stbi__skip(s,4);       // skip index of first colormap entry and number of entries
      sz = stbi__get8(s);    //   check bits per palette color entry
      if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;
      stbi__skip(s,4);       // skip image x and y origin
   } else { // "normal" image w/o colormap
      if ( (sz != 2) && (sz != 3) && (sz != 10) && (sz != 11) ) goto errorEnd; // only RGB or grey allowed, +/- RLE
      stbi__skip(s,9); // skip colormap specification and image x/y origin
   }
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test width
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (tga_color_type == 1) && (sz != 8) && (sz != 16) ) goto errorEnd; // for colormapped images, bpp is size of an index
   if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;

   res = 1; // if we got this far, everything's good and we can return 1 instead of 0

errorEnd:
   stbi__rewind(s);
   return res;
}